

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkvstore_test.cc
# Opt level: O0

int test_describe_history_monitor_values(void)

{
  code *pcVar1;
  char *__s;
  RkvstoreDescribeHistoryMonitorValuesRequestType *pRVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_229;
  int ret;
  HttpTestListener *local_208;
  HttpTestListener *listener;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [55];
  allocator<char> local_171;
  string local_170 [32];
  RkvstoreDescribeHistoryMonitorValuesRequestType *local_150;
  Rkvstore *rkvstore;
  RkvstoreDescribeHistoryMonitorValuesResponseType resp;
  RkvstoreDescribeHistoryMonitorValuesRequestType req;
  
  aliyun::RkvstoreDescribeHistoryMonitorValuesRequestType::
  RkvstoreDescribeHistoryMonitorValuesRequestType
            ((RkvstoreDescribeHistoryMonitorValuesRequestType *)
             ((long)&resp.monitor_history.field_2 + 8));
  aliyun::RkvstoreDescribeHistoryMonitorValuesResponseType::
  RkvstoreDescribeHistoryMonitorValuesResponseType
            ((RkvstoreDescribeHistoryMonitorValuesResponseType *)&rkvstore);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_170,"cn-hangzhou",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"my_appid",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"my_secret",&local_1d1);
  pRVar2 = (RkvstoreDescribeHistoryMonitorValuesRequestType *)
           aliyun::Rkvstore::CreateRkvstoreClient(local_170,local_1a8,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  local_150 = pRVar2;
  if (pRVar2 == (RkvstoreDescribeHistoryMonitorValuesRequestType *)0x0) {
    aliyun::RkvstoreDescribeHistoryMonitorValuesResponseType::
    ~RkvstoreDescribeHistoryMonitorValuesResponseType
              ((RkvstoreDescribeHistoryMonitorValuesResponseType *)&rkvstore);
    aliyun::RkvstoreDescribeHistoryMonitorValuesRequestType::
    ~RkvstoreDescribeHistoryMonitorValuesRequestType
              ((RkvstoreDescribeHistoryMonitorValuesRequestType *)
               ((long)&resp.monitor_history.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Rkvstore::SetProxyHost((Rkvstore *)pRVar2,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Rkvstore::SetUseTls((Rkvstore *)local_150,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_describe_history_monitor_values_response;
  local_208 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_229);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_229);
  HttpTestListener::Start(local_208);
  std::__cxx11::string::operator=
            ((string *)(resp.monitor_history.field_2._M_local_buf + 8),"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.owner_account.field_2._M_local_buf + 8),"InstanceId");
  std::__cxx11::string::operator=((string *)(req.instance_id.field_2._M_local_buf + 8),"StartTime");
  std::__cxx11::string::operator=((string *)(req.start_time.field_2._M_local_buf + 8),"EndTime");
  std::__cxx11::string::operator=
            ((string *)(req.end_time.field_2._M_local_buf + 8),"IntervalForHistory");
  std::__cxx11::string::operator=
            ((string *)(req.interval_for_history.field_2._M_local_buf + 8),"MonitorKeys");
  aliyun::Rkvstore::DescribeHistoryMonitorValues
            (local_150,
             (RkvstoreDescribeHistoryMonitorValuesResponseType *)
             ((long)&resp.monitor_history.field_2 + 8),(RkvstoreErrorInfo *)&rkvstore);
  HttpTestListener::WaitComplete(local_208);
  pHVar3 = local_208;
  if (local_208 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_208);
    operator_delete(pHVar3,0x180);
  }
  pRVar2 = local_150;
  if (local_150 != (RkvstoreDescribeHistoryMonitorValuesRequestType *)0x0) {
    aliyun::Rkvstore::~Rkvstore((Rkvstore *)local_150);
    operator_delete(pRVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_describe_history_monitor_values() {
  RkvstoreDescribeHistoryMonitorValuesRequestType req;
  RkvstoreDescribeHistoryMonitorValuesResponseType resp;
  Rkvstore* rkvstore = Rkvstore::CreateRkvstoreClient("cn-hangzhou", "my_appid", "my_secret");
  if(!rkvstore) return 0;
  rkvstore->SetProxyHost("127.0.0.1:12234");
  rkvstore->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_describe_history_monitor_values_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.instance_id = "InstanceId";
  req.start_time = "StartTime";
  req.end_time = "EndTime";
  req.interval_for_history = "IntervalForHistory";
  req.monitor_keys = "MonitorKeys";
  int ret = rkvstore->DescribeHistoryMonitorValues(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete rkvstore;
}